

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O3

void __thiscall net_uv::KCPServer::onSessionClose(KCPServer *this,Session *session)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  if ((session != (Session *)0x0) &&
     (p_Var4 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var4 != (_Base_ptr)0x0)) {
    _Var2 = session->m_sessionID;
    p_Var1 = &(this->m_allSession)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      bVar5 = p_Var4[1]._M_color < _Var2;
      if (!bVar5) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar5];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var3[1]._M_color <= _Var2)) {
      *(undefined1 *)&p_Var3[1]._M_left = 1;
      (*(this->super_Server).super_Runnable._vptr_Runnable[5])(this,6,session,0,0);
      return;
    }
  }
  return;
}

Assistant:

void KCPServer::onSessionClose(Session* session)
{
	if (session == NULL)
	{
		return;
	}
	auto it = m_allSession.find(session->getSessionID());
	if (it != m_allSession.end())
	{
		it->second.isInvalid = true;
		pushThreadMsg(NetThreadMsgType::DIS_CONNECT, session);
	}
}